

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O0

int Aig_ManVerifyUsingBdds_int(Aig_Man_t *p,Saig_ParBbr_t *pPars)

{
  uint fCheckOutputs_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  DdManager *dd_00;
  abctime aVar5;
  Vec_Ptr_t *vOnionRings_00;
  DdNode **pbOutputs_00;
  DdNode **pbParts_00;
  DdNode *n;
  DdNode *pDVar6;
  Abc_Cex_t *pAVar7;
  DdNode *bIntersect;
  Vec_Ptr_t *vOnionRings;
  abctime clk;
  int i;
  int RetValue;
  DdNode *bTemp;
  DdNode *bInitial;
  DdNode **pbOutputs;
  DdNode **pbParts;
  DdManager *dd;
  int fCheckOutputs;
  Saig_ParBbr_t *pPars_local;
  Aig_Man_t *p_local;
  
  fCheckOutputs_00 = (uint)((pPars->fSkipOutCheck != 0 ^ 0xffU) & 1);
  aVar4 = Abc_Clock();
  iVar1 = Saig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrReach.c"
                  ,0x1c0,"int Aig_ManVerifyUsingBdds_int(Aig_Man_t *, Saig_ParBbr_t *)");
  }
  dd_00 = Aig_ManComputeGlobalBdds(p,pPars->nBddMax,1,pPars->fReorder,pPars->fVerbose);
  if (dd_00 == (DdManager *)0x0) {
    if (pPars->fSilent == 0) {
      printf("The number of intermediate BDD nodes exceeded the limit (%d).\n",
             (ulong)(uint)pPars->nBddMax);
    }
    p_local._4_4_ = -1;
  }
  else {
    if (pPars->fVerbose != 0) {
      uVar2 = Cudd_ReadKeys(dd_00);
      uVar3 = Cudd_ReadDead(dd_00);
      printf("Shared BDD size is %6d nodes.\n",(ulong)(uVar2 - uVar3));
    }
    if (pPars->TimeLimit != 0) {
      iVar1 = pPars->TimeLimit;
      aVar5 = Abc_Clock();
      if ((long)iVar1 <= (aVar5 - aVar4) / 1000000) {
        printf("Reached timeout after constructing global BDDs (%d seconds).\n",
               (ulong)(uint)pPars->TimeLimit,(aVar5 - aVar4) % 1000000);
        Cudd_Quit(dd_00);
        return -1;
      }
    }
    vOnionRings_00 = Vec_PtrAlloc(1000);
    pbOutputs_00 = Aig_ManCreateOutputs(dd_00,p);
    pbParts_00 = Aig_ManCreatePartitions(dd_00,p,pPars->fReorder,pPars->fVerbose);
    n = Aig_ManInitStateVarMap(dd_00,p,pPars->fVerbose);
    Cudd_Ref(n);
    if (pPars->fReorderImage != 0) {
      Cudd_AutodynEnable(dd_00,CUDD_REORDER_SYMM_SIFT);
    }
    clk._4_4_ = -1;
    for (clk._0_4_ = 0; iVar1 = Saig_ManPoNum(p), (int)(uint)clk < iVar1; clk._0_4_ = (uint)clk + 1)
    {
      if ((fCheckOutputs_00 != 0) &&
         (iVar1 = Cudd_bddLeq(dd_00,n,(DdNode *)((ulong)pbOutputs_00[(int)(uint)clk] ^ 1)),
         iVar1 == 0)) {
        pDVar6 = Cudd_bddIntersect(dd_00,n,pbOutputs_00[(int)(uint)clk]);
        Cudd_Ref(pDVar6);
        if (p->pSeqModel != (Abc_Cex_t *)0x0) {
          __assert_fail("p->pSeqModel == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrReach.c"
                        ,0x1ed,"int Aig_ManVerifyUsingBdds_int(Aig_Man_t *, Saig_ParBbr_t *)");
        }
        pAVar7 = Aig_ManVerifyUsingBddsCountExample
                           (p,dd_00,pbParts_00,vOnionRings_00,pDVar6,(uint)clk,pPars->fVerbose,
                            pPars->fSilent);
        p->pSeqModel = pAVar7;
        Cudd_RecursiveDeref(dd_00,pDVar6);
        if (pPars->fSilent == 0) {
          Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d. ",(ulong)(uint)clk,
                    p->pName,0xffffffff);
        }
        clk._4_4_ = 0;
        break;
      }
    }
    for (clk._0_4_ = 0; iVar1 = Vec_PtrSize(vOnionRings_00), (int)(uint)clk < iVar1;
        clk._0_4_ = (uint)clk + 1) {
      pDVar6 = (DdNode *)Vec_PtrEntry(vOnionRings_00,(uint)clk);
      Cudd_RecursiveDeref(dd_00,pDVar6);
    }
    Vec_PtrFree(vOnionRings_00);
    if (clk._4_4_ == -1) {
      clk._4_4_ = Aig_ManComputeReachable(dd_00,p,pbParts_00,n,pbOutputs_00,pPars,fCheckOutputs_00);
    }
    Cudd_RecursiveDeref(dd_00,n);
    for (clk._0_4_ = 0; iVar1 = Saig_ManRegNum(p), (int)(uint)clk < iVar1; clk._0_4_ = (uint)clk + 1
        ) {
      Cudd_RecursiveDeref(dd_00,pbParts_00[(int)(uint)clk]);
    }
    if (pbParts_00 != (DdNode **)0x0) {
      free(pbParts_00);
    }
    for (clk._0_4_ = 0; iVar1 = Saig_ManPoNum(p), (int)(uint)clk < iVar1; clk._0_4_ = (uint)clk + 1)
    {
      Cudd_RecursiveDeref(dd_00,pbOutputs_00[(int)(uint)clk]);
    }
    if (pbOutputs_00 != (DdNode **)0x0) {
      free(pbOutputs_00);
    }
    Cudd_Quit(dd_00);
    if (pPars->fSilent == 0) {
      Abc_Print(1,"%s =","Time");
      aVar5 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
      fflush(_stdout);
    }
    p_local._4_4_ = clk._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

int Aig_ManVerifyUsingBdds_int( Aig_Man_t * p, Saig_ParBbr_t * pPars )
{
    int fCheckOutputs = !pPars->fSkipOutCheck;
    DdManager * dd;
    DdNode ** pbParts, ** pbOutputs;
    DdNode * bInitial, * bTemp;
    int RetValue, i;
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vOnionRings;

    assert( Saig_ManRegNum(p) > 0 );

    // compute the global BDDs of the latches
    dd = Aig_ManComputeGlobalBdds( p, pPars->nBddMax, 1, pPars->fReorder, pPars->fVerbose );    
    if ( dd == NULL )
    {
        if ( !pPars->fSilent )
            printf( "The number of intermediate BDD nodes exceeded the limit (%d).\n", pPars->nBddMax );
        return -1;
    }
    if ( pPars->fVerbose )
        printf( "Shared BDD size is %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // check the runtime limit
    if ( pPars->TimeLimit && pPars->TimeLimit <= (Abc_Clock()-clk)/CLOCKS_PER_SEC )
    {
        printf( "Reached timeout after constructing global BDDs (%d seconds).\n",  pPars->TimeLimit );
        Cudd_Quit( dd );
        return -1;
    }

    // start the onion rings
    vOnionRings = Vec_PtrAlloc( 1000 );

    // save outputs
    pbOutputs = Aig_ManCreateOutputs( dd, p );

    // create partitions
    pbParts = Aig_ManCreatePartitions( dd, p, pPars->fReorder, pPars->fVerbose );

    // create the initial state and the variable map
    bInitial  = Aig_ManInitStateVarMap( dd, p, pPars->fVerbose );  Cudd_Ref( bInitial );

    // set reordering
    if ( pPars->fReorderImage )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );

    // check the result
    RetValue = -1;
    for ( i = 0; i < Saig_ManPoNum(p); i++ )
    {
        if ( fCheckOutputs && !Cudd_bddLeq( dd, bInitial, Cudd_Not(pbOutputs[i]) ) )
        {
            DdNode * bIntersect;
            bIntersect = Cudd_bddIntersect( dd, bInitial, pbOutputs[i] );  Cudd_Ref( bIntersect );
            assert( p->pSeqModel == NULL );
            p->pSeqModel = Aig_ManVerifyUsingBddsCountExample( p, dd, pbParts, 
                vOnionRings, bIntersect, i, pPars->fVerbose, pPars->fSilent ); 
            Cudd_RecursiveDeref( dd, bIntersect );
            if ( !pPars->fSilent )
                Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", i, p->pName, -1 );
            RetValue = 0;
            break;
        }
    }
    // free the onion rings
    Vec_PtrForEachEntry( DdNode *, vOnionRings, bTemp, i )
        Cudd_RecursiveDeref( dd, bTemp );
    Vec_PtrFree( vOnionRings );
    // explore reachable states
    if ( RetValue == -1 )
        RetValue = Aig_ManComputeReachable( dd, p, pbParts, bInitial, pbOutputs, pPars, fCheckOutputs ); 

    // cleanup
    Cudd_RecursiveDeref( dd, bInitial );
    for ( i = 0; i < Saig_ManRegNum(p); i++ )
        Cudd_RecursiveDeref( dd, pbParts[i] );
    ABC_FREE( pbParts );
    for ( i = 0; i < Saig_ManPoNum(p); i++ )
        Cudd_RecursiveDeref( dd, pbOutputs[i] );
    ABC_FREE( pbOutputs );
//    if ( RetValue == -1 )
        Cudd_Quit( dd );
//    else
//        Bbr_StopManager( dd );

    // report the runtime
    if ( !pPars->fSilent )
    {
    ABC_PRT( "Time", Abc_Clock() - clk );
    fflush( stdout );
    }
    return RetValue;
}